

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O3

int rtreeColumn(sqlite3_vtab_cursor *cur,sqlite3_context *ctx,int i)

{
  byte bVar1;
  byte bVar2;
  sqlite3_vtab *psVar3;
  u8 *puVar4;
  int iVar5;
  RtreeNode *pRVar6;
  long lVar7;
  MemValue val;
  Mem *pMem;
  sqlite3_vtab *psVar8;
  int rc;
  int local_2c;
  
  if (*(char *)((long)&cur[1].pVtab + 1) == '\0') {
    if (*(int *)((long)&cur[4].pVtab + 4) == 0) {
      psVar8 = (sqlite3_vtab *)0x0;
    }
    else {
      psVar8 = cur[6].pVtab;
    }
  }
  else {
    psVar8 = (sqlite3_vtab *)(cur + 7);
  }
  psVar3 = cur->pVtab;
  local_2c = 0;
  pRVar6 = rtreeNodeOfFirstSearchPoint((RtreeCursor *)cur,&local_2c);
  iVar5 = local_2c;
  if (psVar8 == (sqlite3_vtab *)0x0 || local_2c != 0) {
    return local_2c;
  }
  bVar1 = *(byte *)((long)&psVar8->zErrMsg + 2);
  bVar2 = psVar3[1].field_0xe;
  puVar4 = pRVar6->zData;
  if (i == 0) {
    val.i = readInt64(puVar4 + (ulong)bVar2 * (ulong)bVar1 + 4);
    pMem = ctx->pOut;
    if ((pMem->flags & 0x2460) != 0) goto LAB_00188f7b;
    (pMem->u).i = (i64)val;
  }
  else {
    lVar7 = (long)(int)((uint)bVar2 * (uint)bVar1 + i * 4 + 8);
    val.i = (ulong)puVar4[lVar7 + 3] |
            (ulong)puVar4[lVar7 + 2] << 8 |
            (long)(int)((uint)puVar4[lVar7] << 0x18) | (ulong)puVar4[lVar7 + 1] << 0x10;
    if (psVar3[1].field_0xd == '\0') {
      sqlite3VdbeMemSetDouble(ctx->pOut,(double)(float)val.nZero);
      return iVar5;
    }
    pMem = ctx->pOut;
    if ((pMem->flags & 0x2460) != 0) {
LAB_00188f7b:
      vdbeReleaseAndSetInt64(pMem,val.i);
      return iVar5;
    }
    pMem->u = val;
  }
  pMem->flags = 4;
  return iVar5;
}

Assistant:

static int rtreeColumn(sqlite3_vtab_cursor *cur, sqlite3_context *ctx, int i){
  Rtree *pRtree = (Rtree *)cur->pVtab;
  RtreeCursor *pCsr = (RtreeCursor *)cur;
  RtreeSearchPoint *p = rtreeSearchPointFirst(pCsr);
  RtreeCoord c;
  int rc = SQLITE_OK;
  RtreeNode *pNode = rtreeNodeOfFirstSearchPoint(pCsr, &rc);

  if( rc ) return rc;
  if( p==0 ) return SQLITE_OK;
  if( i==0 ){
    sqlite3_result_int64(ctx, nodeGetRowid(pRtree, pNode, p->iCell));
  }else{
    if( rc ) return rc;
    nodeGetCoord(pRtree, pNode, p->iCell, i-1, &c);
#ifndef SQLITE_RTREE_INT_ONLY
    if( pRtree->eCoordType==RTREE_COORD_REAL32 ){
      sqlite3_result_double(ctx, c.f);
    }else
#endif
    {
      assert( pRtree->eCoordType==RTREE_COORD_INT32 );
      sqlite3_result_int(ctx, c.i);
    }
  }
  return SQLITE_OK;
}